

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_ht_test.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  uint uVar2;
  void *__s;
  result_type rVar3;
  ostream *poVar4;
  byte bVar5;
  uint uVar6;
  unsigned_long *i;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  *pBVar7;
  size_t sVar8;
  long lVar9;
  default_random_engine en;
  uniform_int_distribution<unsigned_long> dis;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  bht;
  unsigned_long local_8c8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_8c0;
  uniform_int_distribution<unsigned_long> local_8b8;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  local_8a8;
  
  __s = operator_new(80000000);
  memset(__s,0,80000000);
  neatlib::
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  ::BasicHashTable(&local_8a8);
  uVar2 = std::chrono::_V2::steady_clock::now();
  uVar6 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
  local_8c0._M_x = (unsigned_long)(uVar6 + uVar2 + (uint)(uVar2 + uVar6 == 0));
  local_8b8._M_param._M_a = 0;
  local_8b8._M_param._M_b = 20000000;
  lVar9 = 0;
  do {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_8b8,&local_8c0,&local_8b8._M_param);
    *(result_type *)((long)__s + lVar9) = rVar3;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 80000000);
  lVar9 = 0;
  std::chrono::_V2::steady_clock::now();
  do {
    local_8c8 = 10;
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Insert(&local_8a8,(unsigned_long *)((long)__s + lVar9),&local_8c8);
    lVar9 = lVar9 + 8;
  } while (lVar9 != 80000000);
  std::chrono::_V2::steady_clock::now();
  lVar9 = 0;
  do {
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Get(&local_8a8,(unsigned_long *)((long)__s + lVar9));
    lVar9 = lVar9 + 8;
  } while (lVar9 != 80000000);
  std::chrono::_V2::steady_clock::now();
  lVar9 = 0;
  do {
    if (local_8a8.max_level_ != 0) {
      bVar5 = 0;
      pBVar7 = &local_8a8;
      sVar8 = local_8a8.max_level_;
      while (pBVar7 = *(BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                        **)((long)(pBVar7->root_node_).arr_._M_elems +
                           ((ulong)*(tuple<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node_*,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
                                     *)((long)__s + lVar9) >> (bVar5 & 0x3f) & 0xff) * 8),
            pBVar7 != (BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
                       *)0x0) {
        if ((pBVar7->root_node_).super_node.type_ == false) {
          if ((node *)*(tuple<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node_*,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
                        *)((long)__s + lVar9) ==
              (_Head_base<0UL,_neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node_*,_false>
               )*(_Tuple_impl<0UL,_neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node_*,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
                  *)&(pBVar7->root_node_).arr_._M_elems[0]._M_t.
                     super___uniq_ptr_impl<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
             ) {
            (((unique_ptr<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
               *)((long)(pBVar7->root_node_).arr_._M_elems + 8))->_M_t).
            super___uniq_ptr_impl<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
            ._M_t = (tuple<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node_*,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::node>_>
                     )0x14;
          }
          break;
        }
        bVar5 = bVar5 + 8;
        sVar8 = sVar8 - 1;
        if (sVar8 == 0) break;
      }
    }
    lVar9 = lVar9 + 8;
    if (lVar9 == 80000000) {
      std::chrono::_V2::steady_clock::now();
      lVar9 = 0;
      do {
        neatlib::
        BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
        ::Remove(&local_8a8,(unsigned_long *)((long)__s + lVar9));
        lVar9 = lVar9 + 8;
      } while (lVar9 != 80000000);
      std::chrono::_V2::steady_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"INSERTION TIME: ",0x10);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"GETTING TIME:   ",0x10);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"UPDATING TIME:  ",0x10);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"REMOVING TIME:  ",0x10);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::
      deque<std::unique_ptr<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node>_>,_std::allocator<std::unique_ptr<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node>_>_>_>
      ::~deque((deque<std::unique_ptr<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node>_>,_std::allocator<std::unique_ptr<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node,_std::default_delete<neatlib::BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>::array_node>_>_>_>
                *)&local_8a8.pool_);
      lVar9 = 0x800;
      do {
        pvVar1 = *(void **)((long)(local_8a8.root_node_.arr_._M_elems + -1) + lVar9);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,1);
        }
        *(undefined8 *)((long)(local_8a8.root_node_.arr_._M_elems + -1) + lVar9) = 0;
        lVar9 = lVar9 + -8;
      } while (lVar9 != 0);
      operator_delete(__s,80000000);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    vector<size_t> keys(TOTAL_ELEMENTS, 0);
    neatlib::BasicHashTable<size_t,
                              size_t,
                              std::hash<size_t>,
                              std::equal_to<size_t>,
                              std::allocator<std::pair<const size_t, size_t>>,
                              8> bht;
    default_random_engine en(static_cast<unsigned int>(steady_clock::now().time_since_epoch().count()));
    uniform_int_distribution<size_t> dis(0, RANGE);
    std::size_t right = 0, right2 = 0, right3 = 0;
    for (auto &i : keys) i = dis(en);

    auto t1 = steady_clock::now();
    for (const auto &i : keys)
        bht.Insert(i, 10);
    auto t2 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Get(i).second == 10)
            ++right;

    auto t3 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Update(i, 20))
            ++right2;
    auto t4 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Remove(i))
            ++right3;

    auto t5 = steady_clock::now();

    cout << "INSERTION TIME: " << duration_cast<milliseconds>(t2 - t1).count() << endl;
    cout << "GETTING TIME:   " << duration_cast<milliseconds>(t3 - t2).count() << "  " << right << endl;
    cout << "UPDATING TIME:  " << duration_cast<milliseconds>(t4 - t3).count() << "  " << right2 << endl;
    cout << "REMOVING TIME:  " << duration_cast<milliseconds>(t5 - t4).count() << "  " << bht.Size() << "  "
         << right3 << endl;

}